

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall Tree::BuildVirtualFolder(Tree *this,cmXMLWriter *xml)

{
  bool bVar1;
  pointer this_00;
  allocator local_a9;
  string local_a8;
  __normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_> local_88;
  __normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_> local_80;
  const_iterator it;
  undefined1 local_70 [8];
  string virtualFolders;
  allocator local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xml_local;
  Tree *this_local;
  
  local_18 = xml;
  xml_local = (cmXMLWriter *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"Option",&local_39);
  cmXMLWriter::StartElement(xml,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_70,"CMake Files\\;",(allocator *)((long)&it._M_current + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  local_80._M_current = (Tree *)std::vector<Tree,_std::allocator<Tree>_>::begin(&this->folders);
  while( true ) {
    local_88._M_current = (Tree *)std::vector<Tree,_std::allocator<Tree>_>::end(&this->folders);
    bVar1 = __gnu_cxx::operator!=(&local_80,&local_88);
    if (!bVar1) break;
    this_00 = __gnu_cxx::__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>
              ::operator->(&local_80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a8,"",&local_a9);
    BuildVirtualFolderImpl(this_00,(string *)local_70,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    __gnu_cxx::__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>::
    operator++(&local_80);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>
            (local_18,"virtualFolders",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  cmXMLWriter::EndElement(local_18);
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

void Tree::BuildVirtualFolder(cmXMLWriter& xml) const
{
  xml.StartElement("Option");
  std::string virtualFolders = "CMake Files\\;";
  for (std::vector<Tree>::const_iterator it = folders.begin();
       it != folders.end(); ++it) {
    it->BuildVirtualFolderImpl(virtualFolders, "");
  }
  xml.Attribute("virtualFolders", virtualFolders);
  xml.EndElement();
}